

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZAnalysis.cpp
# Opt level: O1

TPZVec<double> * __thiscall
TPZAnalysis::Integrate
          (TPZVec<double> *__return_storage_ptr__,TPZAnalysis *this,string *varname,
          set<int,_std::less<int>,_std::allocator<int>_> *matids)

{
  _Rb_tree_header *p_Var1;
  _Rb_tree_node_base *__k;
  long lVar2;
  TPZCompEl *this_00;
  TPZVec<double> *pTVar3;
  mapped_type_conflict4 mVar4;
  uint uVar5;
  _Base_ptr p_Var6;
  mapped_type_conflict4 *pmVar7;
  _Base_ptr p_Var8;
  TPZCompEl **ppTVar9;
  TPZGeoEl *pTVar10;
  _Base_ptr p_Var11;
  ulong uVar12;
  ulong uVar13;
  long nelem;
  ulong uVar14;
  int matid;
  TPZManVector<double,_3> locres;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> variableids;
  TPZManVector<double,_3> result;
  int local_144;
  TPZManVector<double,_3> local_140;
  TPZVec<double> *local_108;
  _func_int **local_100;
  long local_f8;
  undefined **local_f0;
  void *local_e8;
  ulong local_e0;
  TPZManVector<double,_3> local_d0;
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  local_98;
  TPZManVector<double,_3> local_68;
  
  local_98._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_98._M_impl.super__Rb_tree_header._M_header;
  local_98._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  uVar14 = 0;
  local_98._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_98._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var8 = (this->fCompMesh->fMaterialVec)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_108 = __return_storage_ptr__;
  local_98._M_impl.super__Rb_tree_header._M_header._M_right =
       local_98._M_impl.super__Rb_tree_header._M_header._M_left;
  if ((_Rb_tree_header *)p_Var8 !=
      &(this->fCompMesh->fMaterialVec)._M_t._M_impl.super__Rb_tree_header) {
    p_Var1 = &(matids->_M_t)._M_impl.super__Rb_tree_header;
    uVar14 = 0;
    do {
      __k = p_Var8 + 1;
      p_Var11 = (matids->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
      p_Var6 = &p_Var1->_M_header;
      if (p_Var11 != (_Base_ptr)0x0) {
        do {
          if ((int)__k->_M_color <= (int)p_Var11[1]._M_color) {
            p_Var6 = p_Var11;
          }
          p_Var11 = (&p_Var11->_M_left)[(int)p_Var11[1]._M_color < (int)__k->_M_color];
        } while (p_Var11 != (_Base_ptr)0x0);
      }
      p_Var11 = &p_Var1->_M_header;
      if (((_Rb_tree_header *)p_Var6 != p_Var1) &&
         (p_Var11 = p_Var6, (int)__k->_M_color < (int)p_Var6[1]._M_color)) {
        p_Var11 = &p_Var1->_M_header;
      }
      if ((_Rb_tree_header *)p_Var11 != p_Var1) {
        mVar4 = (**(code **)(*(long *)p_Var8[1]._M_parent + 0x80))(p_Var8[1]._M_parent,varname);
        pmVar7 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                 operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                             *)&local_98,(key_type *)__k);
        *pmVar7 = mVar4;
        p_Var11 = p_Var8[1]._M_parent;
        pmVar7 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                 operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                             *)&local_98,(key_type *)__k);
        uVar5 = (**(code **)(*(long *)p_Var11 + 0x88))(p_Var11,*pmVar7);
        uVar14 = (ulong)uVar5;
      }
      p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8);
    } while ((_Rb_tree_header *)p_Var8 !=
             &(this->fCompMesh->fMaterialVec)._M_t._M_impl.super__Rb_tree_header);
  }
  local_f8 = (long)(int)uVar14;
  local_d0.super_TPZVec<double>._vptr_TPZVec = (_func_int **)0x0;
  TPZManVector<double,_3>::TPZManVector(&local_68,local_f8,(double *)&local_d0);
  lVar2 = (this->fCompMesh->fElementVec).super_TPZChunkVector<TPZCompEl_*,_10>.fNElements;
  if (0 < lVar2) {
    p_Var1 = &(matids->_M_t)._M_impl.super__Rb_tree_header;
    nelem = 0;
    local_100 = (_func_int **)&PTR__TPZManVector_01841aa0;
    do {
      ppTVar9 = TPZChunkVector<TPZCompEl_*,_10>::operator[]
                          (&(this->fCompMesh->fElementVec).super_TPZChunkVector<TPZCompEl_*,_10>,
                           nelem);
      this_00 = *ppTVar9;
      if ((this_00 != (TPZCompEl *)0x0) &&
         (pTVar10 = TPZCompEl::Reference(this_00), pTVar10 != (TPZGeoEl *)0x0)) {
        local_144 = pTVar10->fMatId;
        p_Var8 = (matids->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
        p_Var11 = &p_Var1->_M_header;
        for (; (_Rb_tree_header *)p_Var8 != (_Rb_tree_header *)0x0;
            p_Var8 = (&p_Var8->_M_left)[(int)*(size_t *)(p_Var8 + 1) < local_144]) {
          if (local_144 <= (int)*(size_t *)(p_Var8 + 1)) {
            p_Var11 = p_Var8;
          }
        }
        p_Var8 = &p_Var1->_M_header;
        if (((_Rb_tree_header *)p_Var11 != p_Var1) &&
           (p_Var8 = p_Var11, local_144 < (int)p_Var11[1]._M_color)) {
          p_Var8 = &p_Var1->_M_header;
        }
        if ((_Rb_tree_header *)p_Var8 != p_Var1) {
          local_140.super_TPZVec<double>._vptr_TPZVec = (_func_int **)0x0;
          TPZManVector<double,_3>::TPZManVector(&local_d0,local_f8,(double *)&local_140);
          pmVar7 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                   operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                               *)&local_98,&local_144);
          (**(code **)(*(long *)this_00 + 0x1c0))(&local_f0,this_00,*pmVar7);
          uVar13 = local_e0;
          local_140.super_TPZVec<double>.fStore = (double *)0x0;
          local_140.super_TPZVec<double>.fNElements = 0;
          local_140.super_TPZVec<double>.fNAlloc = 0;
          local_140.super_TPZVec<double>._vptr_TPZVec = local_100;
          if ((long)local_e0 < 4) {
            local_140.super_TPZVec<double>.fStore = local_140.fExtAlloc;
            local_140.super_TPZVec<double>.fNAlloc = 0;
          }
          else {
            local_140.super_TPZVec<double>.fStore =
                 (double *)operator_new__(-(ulong)(local_e0 >> 0x3d != 0) | local_e0 * 8);
            local_140.super_TPZVec<double>.fNAlloc = uVar13;
          }
          if (0 < (long)uVar13) {
            uVar12 = 0;
            do {
              local_140.super_TPZVec<double>.fStore[uVar12] =
                   *(double *)((long)local_e8 + uVar12 * 8);
              uVar12 = uVar12 + 1;
            } while (uVar13 != uVar12);
          }
          TPZManVector<double,_3>::operator=(&local_d0,&local_140);
          TPZManVector<double,_3>::~TPZManVector(&local_140);
          local_f0 = &PTR__TPZVec_0183b4b0;
          if (local_e8 != (void *)0x0) {
            operator_delete__(local_e8);
          }
          if (0 < (int)uVar14) {
            uVar13 = 0;
            do {
              local_68.super_TPZVec<double>.fStore[uVar13] =
                   local_d0.super_TPZVec<double>.fStore[uVar13] +
                   local_68.super_TPZVec<double>.fStore[uVar13];
              uVar13 = uVar13 + 1;
            } while (uVar14 != uVar13);
          }
          TPZManVector<double,_3>::~TPZManVector(&local_d0);
        }
      }
      nelem = nelem + 1;
    } while (nelem != lVar2);
  }
  pTVar3 = local_108;
  TPZVec<double>::TPZVec(local_108,&local_68.super_TPZVec<double>);
  TPZManVector<double,_3>::~TPZManVector(&local_68);
  std::
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  ::~_Rb_tree(&local_98);
  return pTVar3;
}

Assistant:

TPZVec<STATE> TPZAnalysis::Integrate(const std::string &varname, const std::set<int> &matids)
{
    // the postprocessed index of the varname for each material id
    std::map<int,int> variableids;
    int nvars = 0;
    
    std::map<int,TPZMaterial *>::iterator itmap;
    for (itmap = fCompMesh->MaterialVec().begin(); itmap != fCompMesh->MaterialVec().end(); itmap++) {
        if (matids.find(itmap->first) != matids.end()) {
            variableids[itmap->first] = itmap->second->VariableIndex(varname);
            nvars = itmap->second->NSolutionVariables(variableids[itmap->first]);
        }
    }
    TPZManVector<STATE,3> result(nvars,0.);
    int64_t nelem = fCompMesh->NElements();
    for (int64_t el=0; el<nelem; el++) {
        TPZCompEl *cel = fCompMesh->Element(el);
        if (!cel) {
            continue;
        }
        TPZGeoEl *gel = cel->Reference();
        if (!gel) {
            continue;
        }
        int matid = gel->MaterialId();
        if (matids.find(matid) == matids.end()) {
            continue;
        }
        TPZManVector<STATE,3> locres(nvars,0.);
        locres = cel->IntegrateSolution(variableids[matid]);
        for (int iv=0; iv<nvars; iv++)
        {
            result[iv] += locres[iv];
        }
    }
    return result;
}